

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
          *handler)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  error_handler *this_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg_01;
  internal iVar3;
  type tVar4;
  long *plVar5;
  internal *piVar6;
  uint arg_id;
  internal *piVar7;
  internal *piVar8;
  basic_string_view<char> name;
  null_terminating_iterator<char> nVar9;
  error_handler local_51;
  width_checker<fmt::v5::internal::error_handler> local_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  plVar5 = (long *)it.end_;
  piVar6 = (internal *)it.ptr_;
  if (this == piVar6) {
    iVar3 = (internal)0x0;
  }
  else {
    iVar3 = *this;
  }
  if ((iVar3 == (internal)0x7d) || (iVar3 == (internal)0x3a)) {
    puVar1 = *(undefined4 **)*plVar5;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    next_arg((format_arg *)&local_48.string,
             (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
              *)((undefined8 *)*plVar5)[1]);
    local_50.handler_ = &local_51;
    arg.value_.field_0.string.size = local_48.string.size;
    arg.value_.field_0.long_long_value = local_48.long_long_value;
    arg._16_8_ = local_38;
    arg._24_8_ = uStack_30;
    tVar4 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      (&local_50,arg);
    if ((tVar4 & 0xffffffff80000000) != 0) {
      error_handler::on_error(&local_51,"number is too big");
    }
    *puVar1 = (int)tVar4;
    piVar8 = this;
  }
  else if ((byte)((char)iVar3 - 0x30U) < 10) {
    if ((this == piVar6) || (9 < (byte)((char)*this - 0x30U))) {
      __assert_fail("\'0\' <= *it && *it <= \'9\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/format.h"
                    ,0x674,
                    "unsigned int fmt::internal::parse_nonnegative_int(Iterator &, ErrorHandler &&) [Iterator = fmt::internal::null_terminating_iterator<char>, ErrorHandler = fmt::internal::width_adapter<fmt::internal::specs_checker<fmt::internal::specs_handler<fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>>> &, char> &]"
                   );
    }
    arg_id = 0;
    piVar8 = this + 1;
    do {
      piVar7 = piVar8;
      arg_id = ((int)(char)piVar7[-1] + arg_id * 10) - 0x30;
      piVar8 = piVar6;
      if ((piVar7 == piVar6) || (this = this + 1, piVar8 = this, 9 < (byte)((char)*piVar7 - 0x30U)))
      goto LAB_00128c7e;
      piVar8 = piVar7 + 1;
    } while (arg_id < 0xccccccd);
    arg_id = 0x80000000;
    piVar8 = piVar7;
LAB_00128c7e:
    if ((int)arg_id < 0) {
      error_handler::on_error(*(error_handler **)(*plVar5 + 8),"number is too big");
    }
    if ((piVar7 == piVar6) ||
       ((*piVar8 != (internal)0x7d && ((piVar7 == piVar6 || (*piVar8 != (internal)0x3a)))))) {
LAB_00128cca:
      error_handler::on_error(*(error_handler **)(*plVar5 + 8),"invalid format string");
    }
    puVar2 = (undefined8 *)*plVar5;
    puVar1 = (undefined4 *)*puVar2;
    this_00 = (error_handler *)puVar2[1];
    if (0 < *(int *)(this_00 + 0x10)) {
      error_handler::on_error(this_00,"cannot switch from automatic to manual argument indexing");
    }
    *(undefined4 *)(this_00 + 0x10) = 0xffffffff;
    context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    ::do_get_arg((format_arg *)&local_48.string,
                 (context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                  *)puVar2[1],arg_id);
    local_50.handler_ = &local_51;
    arg_01.value_.field_0.string.size = local_48.string.size;
    arg_01.value_.field_0.long_long_value = local_48.long_long_value;
    arg_01._16_8_ = local_38;
    arg_01._24_8_ = uStack_30;
    tVar4 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      (&local_50,arg_01);
    if ((tVar4 & 0xffffffff80000000) != 0) {
      error_handler::on_error(&local_51,"number is too big");
    }
    *puVar1 = (int)tVar4;
  }
  else {
    if ((iVar3 != (internal)0x5f) && (0x19 < (byte)(((byte)iVar3 & 0xdf) + 0xbf)))
    goto LAB_00128cca;
    name.size_ = 0;
    piVar7 = this + 1;
    do {
      piVar8 = piVar7;
      if (piVar8 == piVar6) {
        iVar3 = (internal)0x0;
      }
      else {
        iVar3 = *piVar8;
      }
      piVar7 = piVar8 + 1;
      name.size_ = name.size_ + 1;
    } while ((((byte)((char)iVar3 - 0x30U) < 10) || (iVar3 == (internal)0x5f)) ||
            ((byte)(((byte)iVar3 & 0xdf) + 0xbf) < 0x1a));
    if ((long)name.size_ < 0) {
      __assert_fail("(value >= 0) && \"negative value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/core.h"
                    ,0xde,
                    "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                   );
    }
    puVar1 = *(undefined4 **)*plVar5;
    name.data_ = (char *)this;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    get_arg((format_arg *)&local_48.string,
            (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
             *)((undefined8 *)*plVar5)[1],name);
    local_50.handler_ = &local_51;
    arg_00.value_.field_0.string.size = local_48.string.size;
    arg_00.value_.field_0.long_long_value = local_48.long_long_value;
    arg_00._16_8_ = local_38;
    arg_00._24_8_ = uStack_30;
    tVar4 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      (&local_50,arg_00);
    if ((tVar4 & 0xffffffff80000000) != 0) {
      error_handler::on_error(&local_51,"number is too big");
    }
    *puVar1 = (int)tVar4;
  }
  nVar9.end_ = (char *)piVar6;
  nVar9.ptr_ = (char *)piVar8;
  return nVar9;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(
            pointer_from(start), to_unsigned(it - start)));
  return it;
}